

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O1

void __thiscall CCDPP_MPI::train(CCDPP_MPI *this)

{
  value_type_conflict1 *_q4d;
  value_type_conflict1 *_q4d_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer pRVar5;
  pool *ppVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  void *pvVar12;
  mapped_type *pmVar13;
  pointer pRVar14;
  ostream *poVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  value_type_conflict1 vVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  value_type_conflict1 score;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM2 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  value_type_conflict1 reg;
  value_type_conflict1 global_reg_1;
  value_type_conflict1 global_loss;
  value_type_conflict1 global_loss_1;
  value_type_conflict1 loss;
  Monitor timer;
  value_type_conflict1 global_reg;
  int local_12c;
  ulong local_128;
  int local_11c;
  void *local_118;
  value_type_conflict1 *local_110;
  value_type_conflict1 *local_108;
  value_type_conflict1 *local_100;
  ulong local_f8;
  void *local_f0;
  double local_e8;
  ulong local_e0;
  _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d8;
  _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  void *local_b0;
  void *local_a8;
  value_type_conflict1 *local_a0;
  double local_98;
  double local_90;
  int local_88;
  timeval local_80;
  timeval local_70;
  function0<void> local_60;
  double local_40;
  double local_38;
  
  uVar17 = (long)this->Q_workload * 8;
  if ((long)this->Q_workload < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar17);
  uVar17 = (long)this->P_workload * 8;
  if ((long)this->P_workload < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  local_a8 = operator_new__(uVar17);
  uVar17 = (long)this->user_num * 8;
  if ((long)this->user_num < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  local_100 = (value_type_conflict1 *)operator_new__(uVar17);
  uVar17 = (long)this->item_num * 8;
  if ((long)this->item_num < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  local_108 = (value_type_conflict1 *)operator_new__(uVar17);
  local_128 = 0;
  local_b0 = pvVar12;
  if (this->parameter->verbose == true) {
    if (0 < this->parameter->k) {
      iVar20 = 0;
      do {
        iVar18 = this->start_user_id;
        if (iVar18 < this->end_user_id) {
          lVar16 = 0;
          do {
            local_c8 = this->Q[(long)this->Q_workload * (long)iVar20 + lVar16] *
                       this->Q[(long)this->Q_workload * (long)iVar20 + lVar16];
            local_98 = (double)CONCAT44(local_98._4_4_,iVar18 + (int)lVar16);
            pmVar13 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&this->user_item_R,(key_type *)&local_98);
            auVar36 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                         (long)(pmVar13->
                                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pmVar13->
                                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start >> 4);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_c8;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_128;
            auVar23 = vfmadd213sd_fma(auVar36,auVar35,auVar23);
            local_128 = auVar23._0_8_;
            iVar18 = this->start_user_id;
            lVar16 = lVar16 + 1;
          } while ((int)lVar16 < this->end_user_id - iVar18);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < this->parameter->k);
    }
    pvVar12 = local_b0;
    local_98 = 0.0;
    pRVar14 = (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar5 = (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pRVar14 != pRVar5) {
      auVar23 = ZEXT816(0) << 0x40;
      do {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pRVar14->score;
        auVar23 = vfmadd231sd_fma(auVar23,auVar36,auVar36);
        pRVar14 = pRVar14 + 1;
      } while (pRVar14 != pRVar5);
      local_98 = auVar23._0_8_;
    }
    MPI_Allreduce(&local_128,&local_60,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    MPI_Allreduce(&local_98,&local_110,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    if (this->machine_id == 0) {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_60.super_function_base.vtable;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = this->parameter->lambda;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_110;
      auVar23 = vfmadd213sd_fma(auVar37,auVar24,auVar1);
      local_c8 = auVar23._0_8_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"machine id ",0xb);
      poVar15 = (ostream *)std::ostream::operator<<(&std::cout,this->machine_id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", iter ",7);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", rank ",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"None",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", time ",7);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," sec, loss ",0xb);
      poVar15 = std::ostream::_M_insert<double>((double)local_110);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", obj ",6);
      poVar15 = std::ostream::_M_insert<double>(local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", diff ",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"None",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,", reg ",6);
      poVar15 = std::ostream::_M_insert<double>((double)local_60.super_function_base.vtable);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
    if (this->machine_id == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"RMSE of training data: ",0x17);
      auVar25._0_8_ = (double)local_110 / (double)this->train_rating_num;
      auVar25._8_8_ = 0;
      if (auVar25._0_8_ < 0.0) {
        dVar22 = sqrt(auVar25._0_8_);
      }
      else {
        auVar23 = vsqrtsd_avx(auVar25,auVar25);
        dVar22 = auVar23._0_8_;
      }
      poVar15 = std::ostream::_M_insert<double>(dVar22);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
  }
  if (this->parameter->max_iter < 1) {
    local_e8 = 0.0;
  }
  else {
    local_d8 = (_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->user_item_R;
    local_d0 = (_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->item_user_R;
    local_40 = 0.0;
    local_e8 = 0.0;
    local_f8 = 1;
    do {
      if (0 < this->parameter->k) {
        local_c8 = 0.0;
        uStack_c0 = 0;
        uVar17 = 0;
        local_12c = 0;
        do {
          local_88 = 0;
          gettimeofday(&local_80,(__timezone_ptr_t)0x0);
          _q4d = this->Q + this->Q_workload * (int)uVar17;
          _q4d_00 = this->P + this->P_workload * (int)uVar17;
          local_f0 = local_a8;
          local_118 = pvVar12;
          local_110 = _q4d;
          local_e0 = uVar17;
          local_a0 = _q4d_00;
          if (0 < this->parameter->num_of_thread) {
            iVar20 = 0;
            do {
              ppVar6 = this->thread_pool;
              local_60.super_function_base.vtable = (vtable_base *)0x0;
              local_60.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x30);
              *(CCDPP_MPI **)local_60.super_function_base.functor.members._0_8_ = this;
              *(void ***)((long)local_60.super_function_base.functor.members._0_8_ + 8) = &local_118
              ;
              *(value_type_conflict1 ***)
               ((long)local_60.super_function_base.functor.members._0_8_ + 0x10) = &local_110;
              *(void ***)((long)local_60.super_function_base.functor.members._0_8_ + 0x18) =
                   &local_f0;
              *(value_type_conflict1 ***)
               ((long)local_60.super_function_base.functor.members._0_8_ + 0x20) = &local_a0;
              *(int *)((long)local_60.super_function_base.functor.members._0_8_ + 0x28) = iVar20;
              local_60.super_function_base.vtable =
                   (vtable_base *)
                   _ZZN5boost9function0IvE9assign_toISt5_BindIFZN9CCDPP_MPI11init_factorEPdS5_S5_S5_EUliE_iEEEEvT_E13stored_vtable
              ;
              boost::threadpool::detail::
              pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
              ::schedule((ppVar6->m_core).px,&local_60);
              boost::function0<void>::~function0(&local_60);
              iVar20 = iVar20 + 1;
            } while (iVar20 < this->parameter->num_of_thread);
          }
          boost::threadpool::detail::
          pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          ::wait((this->thread_pool->m_core).px,(void *)0x0);
          MPI_Allgather(_q4d,this->Q_workload,&ompi_mpi_double,local_100,this->Q_workload,
                        &ompi_mpi_double,&ompi_mpi_comm_world);
          MPI_Allgather(_q4d_00,this->P_workload,&ompi_mpi_double,local_108,this->P_workload,
                        &ompi_mpi_double,&ompi_mpi_comm_world);
          if (local_12c < 5) {
            if (1 < (uint)local_f8) {
              update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                  *)local_d8,_q4d,local_108,this->start_user_id,
                            this->R_workload_update_rating,true);
              update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                  *)local_d0,_q4d_00,local_100,this->start_item_id,
                            this->Rt_workload_update_rating,true);
            }
            local_60.super_function_base.vtable = (vtable_base *)0x0;
            local_110 = (value_type_conflict1 *)0x0;
            if (this->parameter->max_inner_iter < 1) {
              local_11c = local_12c;
              iVar20 = local_11c;
            }
            else {
              bVar9 = (int)local_f8 == 1;
              bVar10 = (int)local_e0 == 0;
              iVar18 = 0;
              do {
                local_60.super_function_base.vtable = (vtable_base *)0x0;
                vVar21 = rank_one_update(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                               *)local_d0,_q4d_00,local_100,this->start_item_id,
                                         this->end_item_id,this->Rt_workload_rank_one_update);
                local_60.super_function_base.vtable =
                     (vtable_base *)(vVar21 + (double)local_60.super_function_base.vtable);
                MPI_Allgather(_q4d_00,this->P_workload,&ompi_mpi_double,local_108,this->P_workload,
                              &ompi_mpi_double,&ompi_mpi_comm_world);
                vVar21 = rank_one_update(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                               *)local_d8,_q4d,local_108,this->start_user_id,
                                         this->end_user_id,this->R_workload_rank_one_update);
                local_60.super_function_base.vtable =
                     (vtable_base *)(vVar21 + (double)local_60.super_function_base.vtable);
                MPI_Allgather(_q4d,this->Q_workload,&ompi_mpi_double,local_100,this->Q_workload,
                              &ompi_mpi_double,&ompi_mpi_comm_world);
                MPI_Allreduce(&local_60,&local_110,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                              &ompi_mpi_comm_world);
                auVar26._8_8_ = 0;
                auVar26._0_8_ = local_110;
                auVar11._8_8_ = uStack_c0;
                auVar11._0_8_ = local_c8;
                if ((double)local_110 < local_c8 * this->parameter->eps) {
                  iVar20 = local_12c + (uint)(iVar18 == 0);
                  break;
                }
                auVar23 = vmaxsd_avx(auVar26,auVar11);
                uStack_c0 = auVar23._8_8_;
                local_c8 = (double)((ulong)(bVar9 && bVar10) *
                                    ((ulong)(iVar18 == 0) * (long)local_c8 +
                                    (ulong)(iVar18 != 0) * auVar23._0_8_) +
                                   (ulong)(!bVar9 || !bVar10) * auVar23._0_8_);
                iVar18 = iVar18 + 1;
                iVar20 = local_12c;
              } while (iVar18 < this->parameter->max_inner_iter);
            }
            local_11c = iVar20;
            update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                *)local_d8,_q4d,local_108,this->start_user_id,
                          this->R_workload_update_rating,false);
            pvVar12 = local_b0;
            local_a0 = (value_type_conflict1 *)
                       update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                           *)local_d0,_q4d_00,local_100,this->start_user_id,
                                     this->Rt_workload_update_rating,false);
            local_88 = 1;
            gettimeofday(&local_70,(__timezone_ptr_t)0x0);
            if (local_88 == 0) {
              gettimeofday(&local_70,(__timezone_ptr_t)0x0);
            }
            auVar27._0_8_ = (double)local_80.tv_sec;
            auVar27._8_8_ = in_XMM4_Qb;
            auVar38._0_8_ = (double)local_80.tv_usec;
            auVar38._8_8_ = in_XMM4_Qb;
            auVar23 = vfmadd231sd_fma(auVar38,ZEXT816(0x412e848000000000),auVar27);
            local_98 = auVar23._0_8_;
            auVar28._0_8_ = (double)local_70.tv_sec;
            auVar28._8_8_ = in_XMM4_Qb;
            auVar45._0_8_ = (double)local_70.tv_usec;
            auVar45._8_8_ = in_XMM4_Qb;
            auVar23 = vfmadd231sd_fma(auVar45,ZEXT816(0x412e848000000000),auVar28);
            local_90 = auVar23._0_8_;
            local_38 = (local_90 - local_98) * 1e-06;
            if (this->parameter->verbose == true) {
              uVar17 = (ulong)(uint)this->start_item_id;
              if (this->start_item_id < this->end_item_id) {
                lVar16 = 0;
                do {
                  local_118 = (void *)CONCAT44(local_118._4_4_,(int)uVar17 + (int)lVar16);
                  pmVar13 = std::__detail::
                            _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_d0,(key_type *)&local_118);
                  auVar7._8_8_ = in_XMM4_Qb;
                  auVar7._0_8_ = in_XMM4_Qa;
                  auVar23 = vcvtusi2sd_avx512f(auVar7,(long)(pmVar13->
                                                                                                                        
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar13->
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 4);
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = _q4d_00[lVar16];
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = local_128;
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = _q4d_00[lVar16] * auVar23._0_8_;
                  auVar36 = vfmadd213sd_fma(auVar46,auVar39,auVar2);
                  dVar22 = *(double *)((long)local_a8 + lVar16 * 8);
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = dVar22;
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = auVar23._0_8_ * dVar22;
                  auVar23 = vfnmadd213sd_fma(auVar29,auVar40,auVar36);
                  local_128 = auVar23._0_8_;
                  lVar16 = lVar16 + 1;
                  uVar17 = (ulong)this->start_item_id;
                } while (lVar16 < (long)((long)this->end_item_id - uVar17));
              }
              uVar17 = (ulong)(uint)this->start_user_id;
              if (this->start_user_id < this->end_user_id) {
                lVar16 = 0;
                do {
                  local_118 = (void *)CONCAT44(local_118._4_4_,(int)uVar17 + (int)lVar16);
                  pmVar13 = std::__detail::
                            _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_d8,(key_type *)&local_118);
                  auVar8._8_8_ = in_XMM4_Qb;
                  auVar8._0_8_ = in_XMM4_Qa;
                  auVar23 = vcvtusi2sd_avx512f(auVar8,(long)(pmVar13->
                                                                                                                        
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar13->
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 4);
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = _q4d[lVar16];
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = local_128;
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = _q4d[lVar16] * auVar23._0_8_;
                  auVar36 = vfmadd213sd_fma(auVar47,auVar41,auVar3);
                  dVar22 = *(double *)((long)pvVar12 + lVar16 * 8);
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = dVar22;
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = auVar23._0_8_ * dVar22;
                  auVar23 = vfnmadd213sd_fma(auVar30,auVar42,auVar36);
                  local_128 = auVar23._0_8_;
                  lVar16 = lVar16 + 1;
                  uVar17 = (ulong)this->start_user_id;
                } while (lVar16 < (long)((long)this->end_user_id - uVar17));
              }
              MPI_Allreduce(&local_128,&local_118,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                            &ompi_mpi_comm_world);
              MPI_Allreduce(&local_a0,&local_f0,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                            &ompi_mpi_comm_world);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = local_118;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = this->parameter->lambda;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_f0;
              auVar23 = vfmadd213sd_fma(auVar43,auVar31,auVar4);
              local_b8 = auVar23._0_8_;
              if (this->machine_id == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"machine id ",0xb);
                poVar15 = (ostream *)std::ostream::operator<<(&std::cout,this->machine_id);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", iter ",7);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", rank ",7);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_e0 + 1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", time ",7);
                if (local_88 == 0) {
                  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                }
                auVar32._0_8_ = (double)local_80.tv_sec;
                auVar32._8_8_ = in_XMM4_Qb;
                auVar44._0_8_ = (double)local_80.tv_usec;
                auVar44._8_8_ = in_XMM4_Qb;
                auVar23 = vfmadd231sd_fma(auVar44,ZEXT816(0x412e848000000000),auVar32);
                local_98 = auVar23._0_8_;
                auVar33._0_8_ = (double)local_70.tv_sec;
                auVar33._8_8_ = in_XMM4_Qb;
                auVar48._0_8_ = (double)local_70.tv_usec;
                auVar48._8_8_ = in_XMM4_Qb;
                auVar23 = vfmadd231sd_fma(auVar48,ZEXT816(0x412e848000000000),auVar33);
                local_90 = auVar23._0_8_;
                poVar15 = std::ostream::_M_insert<double>((local_90 - local_98) * 1e-06);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," sec, loss ",0xb);
                poVar15 = std::ostream::_M_insert<double>((double)local_f0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", obj ",6);
                poVar15 = std::ostream::_M_insert<double>(local_b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", diff ",7);
                poVar15 = std::ostream::_M_insert<double>(local_40 - local_b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", reg ",6);
                poVar15 = std::ostream::_M_insert<double>((double)local_118);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
              }
              if (this->machine_id == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"RMSE of training data: ",0x17);
                auVar34._0_8_ = (double)local_f0 / (double)this->train_rating_num;
                auVar34._8_8_ = 0;
                if (auVar34._0_8_ < 0.0) {
                  dVar22 = sqrt(auVar34._0_8_);
                }
                else {
                  auVar23 = vsqrtsd_avx(auVar34,auVar34);
                  dVar22 = auVar23._0_8_;
                }
                poVar15 = std::ostream::_M_insert<double>(dVar22);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
              }
              local_40 = local_b8;
            }
            local_e8 = local_e8 + local_38;
          }
          else {
            local_11c = local_12c;
            pvVar12 = local_b0;
          }
          if (4 < local_12c) break;
          uVar19 = (int)local_e0 + 1;
          uVar17 = (ulong)uVar19;
          local_12c = local_11c;
        } while ((int)uVar19 < this->parameter->k);
      }
      iVar20 = (int)local_f8;
      local_f8 = (ulong)(iVar20 + 1);
    } while (iVar20 < this->parameter->max_iter);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"training time: ",0xf);
  poVar15 = std::ostream::_M_insert<double>(local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," secs",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  operator_delete__(local_100);
  operator_delete__(local_108);
  operator_delete__(local_a8);
  operator_delete__(pvVar12);
  return;
}

Assistant:

void train() {

        // only update the vectors belonging to this machines, but it will keep copies of all vectors from different machines
        value_type *last_q4d = new value_type[Q_workload];
        value_type *last_p4d = new value_type[P_workload];
        value_type *u = new value_type[user_num];
        value_type *v = new value_type[item_num];

        value_type reg = 0;
        value_type prev_obj = 0;

        if (parameter->verbose) {
            for (int d = 0; d < parameter->k; d++) {
                for (int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                    // P is zero matrix at the beginning
                    reg += Q[d * Q_workload + user_index] * Q[d * Q_workload + user_index] * user_item_R[user_index + start_user_id].size();
                }
            }

            value_type loss = 0;
            for(auto rating:train_ratings){
                value_type score = rating.score;
                // P is zero matrix at the beginning
//                for (int d = 0; d < parameter->k; d++) {
//                    score -= Q[d * Q_workload + rating.user_id - start_user_id] * P[d * P_workload + rating.item_id - start_item_id];
//                }
                loss += score * score;
            }

            value_type global_reg, global_loss;

            MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
            MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

            value_type obj = global_loss + global_reg * parameter->lambda;

            if(machine_id==0) {
                cout << "machine id " << machine_id << ", iter " << 0 << ", rank " << "None"
                     << ", time " << 0
                     << " sec, loss " << global_loss << ", obj " << obj << ", diff " << "None"
                     << ", reg " << global_reg
                     << endl;
            }

            if(machine_id==0) {
                cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
            }
        }

        Monitor timer;
        value_type total_training_time = 0;

        for (int outer_iter = 1; outer_iter <= parameter->max_iter; outer_iter++) {

            int early_stop = 0;

            value_type fundec_max = 0;

            for (int d = 0; d < parameter->k; d++) {

                timer.start();

                // the factors belonging to this machines
                value_type *q4d = Q + d * Q_workload;
                value_type *p4d = P + d * P_workload;

                init_factor(q4d, p4d, last_q4d, last_p4d);

                MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
                MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                // it is not stated in the paper, but found in the implementation.
                if(early_stop >= 5) {
                    break;
                }

                // Create Rhat = user_item_R + Wt Ht^T
                if(outer_iter > 1){
                    update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, true);
                    update_rating(item_user_R, p4d, u, start_item_id, Rt_workload_update_rating, true);
                }

                value_type innerfundec_cur = 0;
                value_type global_innerfundec_cur = 0;

                for (int inner_iter = 1; inner_iter <= parameter->max_inner_iter; inner_iter++) {

                    innerfundec_cur = 0;

                    // Update W_t and H_t
                    // Note p should be updated first since it is 0 at the beginning
                    innerfundec_cur += rank_one_update(item_user_R, p4d, u, start_item_id, end_item_id, Rt_workload_rank_one_update);

                    MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    innerfundec_cur += rank_one_update(user_item_R, q4d, v, start_user_id, end_user_id, R_workload_rank_one_update);

                    MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    MPI_Allreduce(&innerfundec_cur, &global_innerfundec_cur, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    if ((global_innerfundec_cur < fundec_max * parameter->eps)) {
                        if (inner_iter == 1) {
                            early_stop += 1;
                        }
                        break;
                    }

                    // the fundec of the first inner iter of the first rank of the first outer iteration could be too large!!
                    if(!(outer_iter==1 && d == 0 && inner_iter==1)) {
                        fundec_max = std::max(fundec_max, global_innerfundec_cur);
                    }

                }

                // Update user_item_R and item_user_R
                update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, false);
                value_type loss = update_rating(item_user_R, p4d, u, start_user_id, Rt_workload_update_rating, false);

                timer.stop();

                total_training_time += timer.getElapsedTime();

                if (parameter->verbose) {

                    for(int item_index = 0; item_index < end_item_id - start_item_id; item_index++) {
                        value_type c = item_user_R[item_index + start_item_id].size();
                        reg += c * p4d[item_index] * p4d[item_index];
                        reg -= c * last_p4d[item_index] * last_p4d[item_index];
                    }

                    for(int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                        value_type c = user_item_R[user_index + start_user_id].size();
                        reg += c * q4d[user_index] * q4d[user_index];
                        reg -= c * last_q4d[user_index] * last_q4d[user_index];
                    }

                    value_type global_reg, global_loss;

                    MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
                    MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    value_type obj = global_loss + global_reg * parameter->lambda;

                    if(machine_id==0) {
                        cout << "machine id " << machine_id << ", iter " << outer_iter << ", rank " << d + 1
                             << ", time " << timer.getElapsedTime()
                             << " sec, loss " << global_loss << ", obj " << obj << ", diff " << prev_obj - obj
                             << ", reg " << global_reg
                             << endl;
                    }

                    prev_obj = obj;

                    if(machine_id==0) {
                        cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
                    }
                }
            }
        }

        cout << "training time: " << total_training_time << " secs" << endl;

        delete[] u;
        delete[] v;
        delete[] last_p4d;
        delete[] last_q4d;

    }